

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streaminfo.c
# Opt level: O0

void mpt_stream_setnewline(mpt_streaminfo *info,int nl,int what)

{
  bool bVar1;
  bool bVar2;
  int what_local;
  int nl_local;
  mpt_streaminfo *info_local;
  
  if ((what & 3U) == 0) {
    bVar2 = false;
    bVar1 = true;
  }
  else if ((what & 3U) == 1) {
    bVar2 = true;
    bVar1 = false;
  }
  else {
    bVar2 = true;
    bVar1 = true;
  }
  if (bVar1) {
    info->_fd = (long)(int)((nl & 3U) << 0xc) | info->_fd & 0xffffffffffffcfff;
  }
  if (bVar2) {
    info->_fd = (long)(int)((nl & 3U) << 0xe) | info->_fd & 0xffffffffffff3fff;
  }
  return;
}

Assistant:

extern void mpt_stream_setnewline(MPT_STRUCT(streaminfo) *info, int nl, int what)
{
	switch (what & 0x3) {
	  case MPT_STREAMFLAG(Read):  what = 0x1; break;
	  case MPT_STREAMFLAG(Write): what = 0x2; break;
	  default:                    what = 0x3;
	}
	nl &= 0x3;
	if (what & 0x1) {
		info->_fd = (nl << 12) | (info->_fd & ~(0x3 << 12));
	}
	if (what & 0x2) {
		info->_fd = (nl << 14) | (info->_fd & ~(0x3 << 14));
	}
}